

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

bool __thiscall
ON_Annotation::Internal_ReadAnnotation(ON_Annotation *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  uint uVar2;
  ON_TextContent *this_00;
  int local_44;
  int iStack_40;
  bool bFromDimStyleTable;
  int k;
  int pair_dex;
  undefined1 uStack_34;
  AnnotationType annotation_type_pairs [3] [2];
  AnnotationType annotation_type;
  uint u;
  ON_TextContent *text;
  bool rc;
  ON_BinaryArchive *pOStack_20;
  int content_version;
  ON_BinaryArchive *archive_local;
  ON_Annotation *this_local;
  
  pOStack_20 = archive;
  archive_local = (ON_BinaryArchive *)this;
  Internal_Destroy(this);
  (this->m_dimstyle_id).Data1 = 0;
  (this->m_dimstyle_id).Data2 = 0;
  (this->m_dimstyle_id).Data3 = 0;
  (this->m_dimstyle_id).Data4[0] = '\0';
  (this->m_dimstyle_id).Data4[1] = '\0';
  (this->m_dimstyle_id).Data4[2] = '\0';
  (this->m_dimstyle_id).Data4[3] = '\0';
  (this->m_dimstyle_id).Data4[4] = '\0';
  (this->m_dimstyle_id).Data4[5] = '\0';
  (this->m_dimstyle_id).Data4[6] = '\0';
  (this->m_dimstyle_id).Data4[7] = '\0';
  memcpy(&this->m_plane,&ON_Plane::World_xy,0x80);
  text._4_4_ = -1;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(pOStack_20,(int *)((long)&text + 4));
  if (bVar1) {
    text._3_1_ = 0;
    if (-1 < text._4_4_) {
      this_00 = (ON_TextContent *)operator_new(0xd8);
      ON_TextContent::ON_TextContent(this_00);
      unique0x10000438 = this_00;
      if (this_00 != (ON_TextContent *)0x0) {
        uVar2 = (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0xb])
                          (this_00,pOStack_20);
        if ((uVar2 & 1) == 0) {
          if (stack0xffffffffffffffd0 != (ON_TextContent *)0x0) {
            (*(stack0xffffffffffffffd0->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
          }
        }
        else {
          this->m_text = stack0xffffffffffffffd0;
          bVar1 = ON_BinaryArchive::Read3dmReferencedComponentId
                            (pOStack_20,DimStyle,&this->m_dimstyle_id);
          if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadPlane(pOStack_20,&this->m_plane), bVar1)) {
            if (text._4_4_ < 1) {
              text._3_1_ = 1;
            }
            else {
              _uStack_34 = 0;
              bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,(ON__UINT32 *)&uStack_34);
              if (bVar1) {
                pair_dex._3_1_ = ON::AnnotationTypeFromUnsigned(_uStack_34);
                if (pair_dex._3_1_ != this->m_annotation_type) {
                  stack0xffffffffffffffc5 = 0x4030501;
                  pair_dex._1_2_ = 0xb02;
                  iStack_40 = 0;
                  while( true ) {
                    bVar1 = false;
                    if (iStack_40 < 3) {
                      bVar1 = pair_dex._3_1_ != this->m_annotation_type;
                    }
                    if (!bVar1) break;
                    for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
                      if ((*(AnnotationType *)((long)&k + (long)local_44 + (long)iStack_40 * 2 + 1)
                           == pair_dex._3_1_) &&
                         (*(AnnotationType *)
                           ((long)&k + (long)(1 - local_44) + (long)iStack_40 * 2 + 1) ==
                          this->m_annotation_type)) {
                        this->m_annotation_type = pair_dex._3_1_;
                        break;
                      }
                    }
                    iStack_40 = iStack_40 + 1;
                  }
                  if (pair_dex._3_1_ != this->m_annotation_type) {
                    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_annotationbase.cpp"
                               ,0x1ce,"","Invalid annotation type.");
                  }
                }
                bVar1 = ON_BinaryArchive::Internal_Read3dmDimStyleOverrides
                                  (pOStack_20,this,text._4_4_ < 2);
                if (bVar1) {
                  if (text._4_4_ < 3) {
                    text._3_1_ = 1;
                  }
                  else {
                    bVar1 = ON_BinaryArchive::ReadVector(pOStack_20,&this->m_horizontal_direction);
                    if (bVar1) {
                      if (text._4_4_ < 4) {
                        text._3_1_ = 1;
                      }
                      else {
                        bVar1 = ON_BinaryArchive::ReadBool(pOStack_20,&this->m_allow_text_scaling);
                        if (bVar1) {
                          text._3_1_ = 1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(pOStack_20);
    if (!bVar1) {
      text._3_1_ = 0;
    }
    this_local._7_1_ = (bool)(text._3_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Annotation::Internal_ReadAnnotation(
  ON_BinaryArchive& archive
  )
{
  Internal_Destroy();
  m_dimstyle_id = ON_nil_uuid;
  m_plane = ON_Plane::World_xy;
  // do not change the value of m_annotation_type
    
  int content_version = -1;
  if (false == archive.BeginRead3dmAnonymousChunk(&content_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (content_version < 0)
      break;
    
    ON_TextContent* text = new ON_TextContent;
    if (nullptr == text)
      break;
    if (false == text->Read(archive))
    {
      delete text;
      break;
    }
    m_text = text;

    if (!archive.Read3dmReferencedComponentId(ON_ModelComponent::Type::DimStyle, &m_dimstyle_id))
      break;

    if (!archive.ReadPlane(m_plane))
      break;

    if (content_version <= 0)
    {
      rc = true;
      break;
    }

    unsigned int u = 0;
    if (!archive.ReadInt(&u))
      break;
    const ON::AnnotationType annotation_type = ON::AnnotationTypeFromUnsigned(u);
    if (annotation_type != m_annotation_type)
    {
      const ON::AnnotationType annotation_type_pairs[3][2]
      {
        // ON_DimLinear linear dimensions can have type = Aligned or Rotated
        {ON::AnnotationType::Aligned,ON::AnnotationType::Rotated},

        // ON_DimRadial radial dimensions can have type = Diameter or Radius
        { ON::AnnotationType::Diameter,ON::AnnotationType::Radius },

        // ON_DimAngular radial dimensions can have type = Angular or Angular3pt
        { ON::AnnotationType::Angular,ON::AnnotationType::Angular3pt },
      };
      for (int pair_dex = 0; pair_dex < 3 && annotation_type != m_annotation_type; pair_dex++)
      {
        for (int k = 0; k < 2; k++)
        {
          if (
            annotation_type_pairs[pair_dex][k] == annotation_type
            && annotation_type_pairs[pair_dex][1-k] == m_annotation_type
            )
          {
            m_annotation_type = annotation_type;
            break;
          }
        }            
      }
      if (annotation_type != m_annotation_type)
      {
        ON_ERROR("Invalid annotation type.");
      }
    }

    // Dale Lear 2016 Dec 12 https://mcneel.myjetbrains.com/youtrack/issue/RH-37176
    // content_version incremented to 2.
    // optional override dimension style move from dimstyle table to annotation object
    const bool bFromDimStyleTable = content_version <= 1;
    if (!archive.Internal_Read3dmDimStyleOverrides(*this, bFromDimStyleTable))
      break;

    if (content_version <= 2)
    {
      rc = true;
      break;
    }

    // content_version = 3 ( 13 July, 2017 )
    if (!archive.ReadVector(m_horizontal_direction))
      break;

    if (content_version <= 3)
    {
      rc = true;
      break;
    }

    // content_version = 4 ( 17 May, 2018 - Lowell)
    if (!archive.ReadBool(&m_allow_text_scaling))
      break;

    rc = true;
    break;
  }
  if (!archive.EndRead3dmChunk())
    rc = false;

  return rc;
}